

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int SSL_set1_verify_cert_store(SSL *ssl,X509_STORE *store)

{
  SSL_CONFIG *pSVar1;
  
  bssl::check_ssl_x509_method(ssl);
  pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
  if (pSVar1 != (SSL_CONFIG *)0x0) {
    set_cert_store((X509_STORE **)
                   ((long)(pSVar1->cert)._M_t.
                          super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter> + 0x50),store,1
                  );
  }
  return (uint)(pSVar1 != (SSL_CONFIG *)0x0);
}

Assistant:

int SSL_set1_verify_cert_store(SSL *ssl, X509_STORE *store) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    return 0;
  }
  return set_cert_store(&ssl->config->cert->verify_store, store, 1);
}